

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_791d::TENSOR_INDEXING_Test::TestBody(TENSOR_INDEXING_Test *this)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  array<unsigned_int,_3UL> size;
  AssertionResult gtest_ar;
  tensor<int,_3U> ts;
  AssertHelper local_78;
  long *local_70;
  uint local_68;
  undefined1 local_60 [12];
  undefined4 uStack_54;
  tensor<int,_3U> local_50;
  
  size._M_elems[2] = 5;
  size._M_elems[0] = 3;
  size._M_elems[1] = 4;
  dnet::data_types::tensor<int,_3U>::tensor(&local_50,size);
  if (local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    memset(local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           ((long)local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-4 - (long)local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
  }
  local_70 = (long *)&DAT_200000001;
  local_68 = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_50,(array<unsigned_int,_3UL> *)&local_70);
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"(ts[{1,2,3}])","0",piVar2,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT44(uStack_54,local_60._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_54,local_60._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_60 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70 = (long *)&DAT_300000002;
  local_68 = 4;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_50,(array<unsigned_int,_3UL> *)&local_70);
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"(ts[{2,3,4}])","0",piVar2,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT44(uStack_54,local_60._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_54,local_60._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_60 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._0_8_ = &DAT_200000001;
  local_60._8_4_ = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_50,(array<unsigned_int,_3UL> *)local_60);
  *piVar2 = 1;
  local_60._0_8_ = &DAT_300000002;
  local_60._8_4_ = 4;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_50,(array<unsigned_int,_3UL> *)local_60);
  *piVar2 = 2;
  local_70 = (long *)&DAT_200000001;
  local_68 = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_50,(array<unsigned_int,_3UL> *)&local_70);
  local_78.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"(ts[{1,2,3}])","1",piVar2,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT44(uStack_54,local_60._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_54,local_60._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_60 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70 = (long *)&DAT_300000002;
  local_68 = 4;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_50,(array<unsigned_int,_3UL> *)&local_70);
  local_78.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"(ts[{2,3,4}])","2",piVar2,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT44(uStack_54,local_60._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_54,local_60._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_60 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TENSOR, INDEXING) {
        tensor<int, 3> ts(0, {3,4,5});
        EXPECT_EQ((ts[{1,2,3}]), 0);
        EXPECT_EQ((ts[{2,3,4}]), 0);
        ts[{1,2,3}] = 1;
        ts[{2,3,4}] = 2;
        EXPECT_EQ((ts[{1,2,3}]), 1);
        EXPECT_EQ((ts[{2,3,4}]), 2);
    }